

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O2

void __thiscall Fl_Input_Type::copy_properties(Fl_Input_Type *this)

{
  Fl_Widget *pFVar1;
  Fl_Widget *pFVar2;
  
  Fl_Widget_Type::copy_properties(&this->super_Fl_Widget_Type);
  pFVar1 = (this->super_Fl_Widget_Type).live_widget;
  pFVar2 = (this->super_Fl_Widget_Type).o;
  *(undefined8 *)((long)&pFVar1[1].label_.image + 4) =
       *(undefined8 *)((long)&pFVar2[1].label_.image + 4);
  *(undefined4 *)((long)&pFVar1[1].label_.deimage + 4) =
       *(undefined4 *)((long)&pFVar2[1].label_.deimage + 4);
  *(undefined4 *)((long)&pFVar1[1].label_.value + 4) =
       *(undefined4 *)((long)&pFVar2[1].label_.value + 4);
  return;
}

Assistant:

virtual void copy_properties() {
    Fl_Widget_Type::copy_properties();
    Fl_Input_ *d = (Fl_Input_*)live_widget, *s = (Fl_Input_*)o;
    d->textfont(s->textfont());
    d->textsize(s->textsize());
    d->textcolor(s->textcolor());
    d->shortcut(s->shortcut());
  }